

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O2

bool flecs::_::pack_args_to_string<Position,Asteroid>(world_t *world,stringstream *str,bool is_each)

{
  char *pcVar1;
  long lVar2;
  ostream *poVar3;
  array<const_char_*,_2UL> ids;
  char *local_40 [2];
  
  local_40[0] = component_info<Position>::name(world);
  local_40[1] = component_info<Asteroid>::name(world);
  poVar3 = (ostream *)(str + 0x10);
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
    pcVar1 = *(char **)((long)local_40 + lVar2);
    if (lVar2 != 0) {
      std::operator<<(poVar3,",");
    }
    std::operator<<(poVar3,"");
    std::operator<<(poVar3,"");
    if (is_each) {
      std::operator<<(poVar3,"ANY:");
    }
    std::operator<<(poVar3,pcVar1);
  }
  return true;
}

Assistant:

bool pack_args_to_string(world_t *world, std::stringstream& str, bool is_each) {
    (void)world;

    std::array<const char*, sizeof...(Components)> ids = {
        (_::component_info<Components>::name(world))...
    };

    std::array<const char*, sizeof...(Components)> inout_modifiers = {
        (inout_modifier<Components>())...
    }; 

    std::array<const char*, sizeof...(Components)> optional_modifiers = {
        (optional_modifier<Components>())...
    };        

    size_t i = 0;
    for (auto id : ids) {
        if (i) {
            str << ",";
        }
        
        str << inout_modifiers[i];
        str << optional_modifiers[i];

        if (is_each) {
            str << "ANY:";
        }
        str << id;
        i ++;
    }  

    return i != 0;
}